

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDSharedSimd128.cpp
# Opt level: O0

Instr * __thiscall LowererMD::Simd128LowerLessThan(LowererMD *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  IRType IVar3;
  undefined4 *puVar4;
  Opnd *this_00;
  Opnd *this_01;
  Opnd *this_02;
  RegOpnd *dstOpnd;
  RegOpnd *dstOpnd_00;
  ThreadContextInfo *pTVar5;
  intptr_t iVar6;
  RegOpnd *dstOpnd_01;
  Instr *pIVar7;
  MemRefOpnd *src2Opnd;
  OpCode local_5a;
  OpCode cmpOpcode;
  RegOpnd *mask;
  MemRefOpnd *signBits;
  RegOpnd *tmpb;
  RegOpnd *tmpa;
  Opnd *src2;
  Opnd *src1;
  Opnd *dst;
  Instr *pInstr;
  Instr *instr_local;
  LowererMD *this_local;
  
  if ((((instr->m_opcode != Simd128_Lt_U4) && (instr->m_opcode != Simd128_Lt_U8)) &&
      (instr->m_opcode != Simd128_Lt_U16)) &&
     (((instr->m_opcode != Simd128_GtEq_U4 && (instr->m_opcode != Simd128_GtEq_U8)) &&
      (instr->m_opcode != Simd128_GtEq_U16)))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0x730,
                       "(instr->m_opcode == Js::OpCode::Simd128_Lt_U4 || instr->m_opcode == Js::OpCode::Simd128_Lt_U8 || instr->m_opcode == Js::OpCode::Simd128_Lt_U16 || instr->m_opcode == Js::OpCode::Simd128_GtEq_U4 || instr->m_opcode == Js::OpCode::Simd128_GtEq_U8 || instr->m_opcode == Js::OpCode::Simd128_GtEq_U16)"
                       ,
                       "instr->m_opcode == Js::OpCode::Simd128_Lt_U4 || instr->m_opcode == Js::OpCode::Simd128_Lt_U8 || instr->m_opcode == Js::OpCode::Simd128_Lt_U16 || instr->m_opcode == Js::OpCode::Simd128_GtEq_U4 || instr->m_opcode == Js::OpCode::Simd128_GtEq_U8 || instr->m_opcode == Js::OpCode::Simd128_GtEq_U16"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  this_00 = IR::Instr::GetDst(instr);
  this_01 = IR::Instr::GetSrc1(instr);
  this_02 = IR::Instr::GetSrc2(instr);
  bVar2 = IR::Opnd::IsRegOpnd(this_00);
  if ((!bVar2) ||
     (((bVar2 = IR::Opnd::IsSimd128B4(this_00), !bVar2 &&
       (bVar2 = IR::Opnd::IsSimd128B8(this_00), !bVar2)) &&
      (bVar2 = IR::Opnd::IsSimd128B16(this_00), !bVar2)))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0x736,
                       "(dst->IsRegOpnd() && (dst->IsSimd128B4() || dst->IsSimd128B8() || dst->IsSimd128B16()))"
                       ,
                       "dst->IsRegOpnd() && (dst->IsSimd128B4() || dst->IsSimd128B8() || dst->IsSimd128B16())"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  bVar2 = IR::Opnd::IsRegOpnd(this_01);
  if ((!bVar2) || (bVar2 = IR::Opnd::IsSimd128(this_01), !bVar2)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0x737,"(src1->IsRegOpnd() && src1->IsSimd128())",
                       "src1->IsRegOpnd() && src1->IsSimd128()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  bVar2 = IR::Opnd::IsRegOpnd(this_02);
  if ((!bVar2) || (bVar2 = IR::Opnd::IsSimd128(this_02), !bVar2)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0x738,"(src2->IsRegOpnd() && src2->IsSimd128())",
                       "src2->IsRegOpnd() && src2->IsSimd128()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  IVar3 = IR::Opnd::GetType(this_01);
  dstOpnd = IR::RegOpnd::New(IVar3,this->m_func);
  IVar3 = IR::Opnd::GetType(this_01);
  dstOpnd_00 = IR::RegOpnd::New(IVar3,this->m_func);
  pTVar5 = Func::GetThreadContextInfo(this->m_func);
  iVar6 = ThreadContextInfo::GetX86DoubleWordSignBitsAddr(pTVar5);
  mask = (RegOpnd *)IR::MemRefOpnd::New(iVar6,TySimd128I4,this->m_func,AddrOpndKindDynamicMisc);
  dstOpnd_01 = IR::RegOpnd::New(TySimd128I4,this->m_func);
  local_5a = PCMPGTD;
  if ((instr->m_opcode == Simd128_Lt_U8) || (instr->m_opcode == Simd128_GtEq_U8)) {
    local_5a = PCMPGTW;
    pTVar5 = Func::GetThreadContextInfo(this->m_func);
    iVar6 = ThreadContextInfo::GetX86WordSignBitsAddr(pTVar5);
    mask = (RegOpnd *)IR::MemRefOpnd::New(iVar6,TySimd128I4,this->m_func,AddrOpndKindDynamicMisc);
  }
  else if ((instr->m_opcode == Simd128_Lt_U16) || (instr->m_opcode == Simd128_GtEq_U16)) {
    local_5a = PCMPGTB;
    pTVar5 = Func::GetThreadContextInfo(this->m_func);
    iVar6 = ThreadContextInfo::GetX86ByteSignBitsAddr(pTVar5);
    mask = (RegOpnd *)IR::MemRefOpnd::New(iVar6,TySimd128I4,this->m_func,AddrOpndKindDynamicMisc);
  }
  pIVar7 = IR::Instr::New(MOVUPS,&dstOpnd_01->super_Opnd,&mask->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(instr,pIVar7);
  Legalize<false>(pIVar7,false);
  pIVar7 = IR::Instr::New(PXOR,&dstOpnd->super_Opnd,this_01,&dstOpnd_01->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(instr,pIVar7);
  Legalize<false>(pIVar7,false);
  pIVar7 = IR::Instr::New(PXOR,&dstOpnd_00->super_Opnd,this_02,&dstOpnd_01->super_Opnd,this->m_func)
  ;
  IR::Instr::InsertBefore(instr,pIVar7);
  Legalize<false>(pIVar7,false);
  pIVar7 = IR::Instr::New(local_5a,this_00,&dstOpnd_00->super_Opnd,&dstOpnd->super_Opnd,this->m_func
                         );
  IR::Instr::InsertBefore(instr,pIVar7);
  Legalize<false>(pIVar7,false);
  if (((instr->m_opcode == Simd128_GtEq_U4) || (instr->m_opcode == Simd128_GtEq_U8)) ||
     (instr->m_opcode == Simd128_GtEq_U16)) {
    pTVar5 = Func::GetThreadContextInfo(this->m_func);
    iVar6 = ThreadContextInfo::GetX86AllNegOnesAddr(pTVar5);
    src2Opnd = IR::MemRefOpnd::New(iVar6,TySimd128I4,this->m_func,AddrOpndKindDynamicMisc);
    pIVar7 = IR::Instr::New(PANDN,this_00,this_00,&src2Opnd->super_Opnd,this->m_func);
    IR::Instr::InsertBefore(instr,pIVar7);
    Legalize<false>(pIVar7,false);
  }
  pIVar7 = instr->m_prev;
  IR::Instr::Remove(instr);
  return pIVar7;
}

Assistant:

IR::Instr* LowererMD::Simd128LowerLessThan(IR::Instr* instr)
{
    Assert(instr->m_opcode == Js::OpCode::Simd128_Lt_U4 || instr->m_opcode == Js::OpCode::Simd128_Lt_U8 || instr->m_opcode == Js::OpCode::Simd128_Lt_U16 ||
        instr->m_opcode == Js::OpCode::Simd128_GtEq_U4 || instr->m_opcode == Js::OpCode::Simd128_GtEq_U8 || instr->m_opcode == Js::OpCode::Simd128_GtEq_U16);

    IR::Instr *pInstr;
    IR::Opnd* dst = instr->GetDst();
    IR::Opnd* src1 = instr->GetSrc1();
    IR::Opnd* src2 = instr->GetSrc2();
    Assert(dst->IsRegOpnd() && (dst->IsSimd128B4() || dst->IsSimd128B8() || dst->IsSimd128B16()));
    Assert(src1->IsRegOpnd() && src1->IsSimd128());
    Assert(src2->IsRegOpnd() && src2->IsSimd128());

    IR::RegOpnd* tmpa = IR::RegOpnd::New(src1->GetType(), m_func);
    IR::RegOpnd* tmpb = IR::RegOpnd::New(src1->GetType(), m_func);

    IR::MemRefOpnd* signBits = IR::MemRefOpnd::New(m_func->GetThreadContextInfo()->GetX86DoubleWordSignBitsAddr(), TySimd128I4, m_func);
    IR::RegOpnd * mask = IR::RegOpnd::New(TySimd128I4, m_func);

    Js::OpCode cmpOpcode = Js::OpCode::PCMPGTD;
    if (instr->m_opcode == Js::OpCode::Simd128_Lt_U8 || instr->m_opcode == Js::OpCode::Simd128_GtEq_U8)
    {
        cmpOpcode = Js::OpCode::PCMPGTW;
        signBits = IR::MemRefOpnd::New(m_func->GetThreadContextInfo()->GetX86WordSignBitsAddr(), TySimd128I4, m_func);
    }
    else if (instr->m_opcode == Js::OpCode::Simd128_Lt_U16 || instr->m_opcode == Js::OpCode::Simd128_GtEq_U16)
    {
        cmpOpcode = Js::OpCode::PCMPGTB;
        signBits = IR::MemRefOpnd::New(m_func->GetThreadContextInfo()->GetX86ByteSignBitsAddr(), TySimd128I4, m_func);
    }

    // MOVUPS mask, [signBits]
    pInstr = IR::Instr::New(Js::OpCode::MOVUPS, mask, signBits, m_func);
    instr->InsertBefore(pInstr);
    Legalize(pInstr);

    // tmpa = PXOR src1, signBits
    pInstr = IR::Instr::New(Js::OpCode::PXOR, tmpa, src1, mask, m_func);
    instr->InsertBefore(pInstr);
    Legalize(pInstr);

    // tmpb = PXOR src2, signBits
    pInstr = IR::Instr::New(Js::OpCode::PXOR, tmpb, src2, mask, m_func);
    instr->InsertBefore(pInstr);
    Legalize(pInstr);

    // dst = cmpOpCode tmpb, tmpa  (Less than, swapped opnds)
    pInstr = IR::Instr::New(cmpOpcode, dst, tmpb, tmpa, m_func);
    instr->InsertBefore(pInstr);
    Legalize(pInstr);

    if (instr->m_opcode == Js::OpCode::Simd128_GtEq_U4 || instr->m_opcode == Js::OpCode::Simd128_GtEq_U8 || instr->m_opcode == Js::OpCode::Simd128_GtEq_U16)
    {
        // for SIMD unsigned int, greaterThanOrEqual == lessThan + Not
        // dst = PANDN dst, X86_ALL_NEG_ONES
        // MOVUPS mask, [allNegOnes]
        pInstr = IR::Instr::New(Js::OpCode::PANDN, dst, dst, IR::MemRefOpnd::New(m_func->GetThreadContextInfo()->GetX86AllNegOnesAddr(), TySimd128I4, m_func), m_func);
        instr->InsertBefore(pInstr);
        Legalize(pInstr);
    }

    pInstr = instr->m_prev;
    instr->Remove();

    return pInstr;
}